

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O2

void __thiscall
OpenMD::ifstrstream::ifstrstream(ifstrstream *this,char *filename,openmode mode,bool checkFilename)

{
  bool bVar1;
  
  std::ios::ios((ios *)&this->field_0x170);
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__002f4cc0);
  (this->super_basic_istream<char,_std::char_traits<char>_>)._vptr_basic_istream =
       (_func_int **)&PTR__ifstrstream_002f4c80;
  *(undefined ***)&this->field_0x170 = &PTR__ifstrstream_002f4ca8;
  std::__cxx11::stringbuf::stringbuf
            ((stringbuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x10);
  std::filebuf::filebuf
            ((filebuf *)&(this->super_basic_istream<char,_std::char_traits<char>_>).field_0x78);
  this->isRead = false;
  std::ios::init((streambuf *)
                 ((long)&(this->super_basic_istream<char,_std::char_traits<char>_>).
                         _vptr_basic_istream +
                 (long)(this->super_basic_istream<char,_std::char_traits<char>_>).
                       _vptr_basic_istream[-3]));
  bVar1 = internalOpen(this,filename,mode | _S_in,false);
  this->isRead = bVar1;
  return;
}

Assistant:

ifstrstream::ifstrstream(const char* filename, std::ios_base::openmode mode,
                           bool checkFilename) :
      std::basic_istream<char, std::char_traits<char>>(0),
      internalFileBuf_(), isRead(false) {
    this->init(&internalFileBuf_);
#if defined(_MSC_VER)
    isRead =
        internalOpen(filename, mode | std::ios_base::in | std::ios_base::binary,
                     checkFilename);
#else
    isRead = internalOpen(filename, mode | std::ios_base::in, checkFilename);
#endif
  }